

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbitmap.cxx
# Opt level: O0

int main(void)

{
  initializer_list<int> list;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  exception *e;
  int x;
  int y;
  OledI2C oled;
  OledBitmap<16,_16> bitmap;
  OledI2C *in_stack_fffffffffffffa30;
  OledBitmap<16,_16> *in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa78 [12];
  undefined4 in_stack_fffffffffffffa84;
  int local_578;
  allocator local_571;
  string local_570 [16];
  OledPixel *in_stack_fffffffffffffaa0;
  OledPixel *in_stack_fffffffffffffaa8;
  OledPoint in_stack_fffffffffffffab0;
  OledI2C *in_stack_fffffffffffffb00;
  uint8_t in_stack_fffffffffffffc27;
  string *in_stack_fffffffffffffc28;
  OledI2C *in_stack_fffffffffffffc30;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_40;
  undefined8 local_38;
  OledBitmap<16,_16> local_30;
  undefined4 local_4;
  
  local_4 = 0;
  local_58 = 0x2000000002;
  uStack_50 = 0;
  local_68 = 0xa80000002a;
  uStack_60 = 4;
  local_78 = 0xa20000003a;
  uStack_70 = 0x15;
  local_88 = 0xea000000ff;
  uStack_80 = 0x4000000055;
  local_98 = 0xaa000000ff;
  uStack_90 = 0x5000000077;
  local_a8 = 0xea0000007f;
  uStack_a0 = 0xd40000007f;
  local_b8 = 0xe80000003f;
  uStack_b0 = 0x500000003f;
  local_c8 = 0xa00000000a;
  uStack_c0 = 0xc00000000f;
  local_40 = &local_c8;
  local_38 = 0x20;
  list._M_len._4_4_ = in_stack_fffffffffffffa84;
  list._0_12_ = in_stack_fffffffffffffa78;
  SSD1306::OledBitmap<16,_16>::OledBitmap(in_stack_fffffffffffffa70,list);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"/dev/i2c-1",&local_571);
  SSD1306::OledI2C::OledI2C
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc27);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  iVar1 = SSD1306::OledBitmap<16,_16>::height(&local_30);
  local_578 = -(iVar1 / 2);
  while( true ) {
    iVar1 = SSD1306::OledI2C::height((OledI2C *)&stack0xfffffffffffffab0);
    iVar2 = SSD1306::OledBitmap<16,_16>::height(&local_30);
    if (iVar1 + iVar2 / 2 <= local_578) break;
    iVar1 = SSD1306::OledBitmap<16,_16>::width(&local_30);
    iVar1 = -(iVar1 / 2);
    while( true ) {
      iVar2 = iVar1;
      iVar3 = SSD1306::OledI2C::width((OledI2C *)&stack0xfffffffffffffab0);
      iVar4 = SSD1306::OledBitmap<16,_16>::width(&local_30);
      if (iVar3 + iVar4 / 2 <= iVar1) break;
      SSD1306::Point<int>::Point((Point<int> *)&stack0xfffffffffffffa7c,iVar2,local_578);
      SSD1306::OledPixel::setFrom
                (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffab0);
      iVar1 = SSD1306::OledBitmap<16,_16>::width(&local_30);
      iVar1 = iVar1 + iVar2;
    }
    iVar1 = SSD1306::OledBitmap<16,_16>::height(&local_30);
    local_578 = iVar1 + local_578;
  }
  SSD1306::OledI2C::displayUpdate(in_stack_fffffffffffffb00);
  SSD1306::OledI2C::~OledI2C(in_stack_fffffffffffffa30);
  SSD1306::OledBitmap<16,_16>::~OledBitmap((OledBitmap<16,_16> *)0x1077e2);
  return 0;
}

Assistant:

int
main()
{
    try
    {
        SSD1306::OledBitmap<16, 16> bitmap
        {
             0b00001010, 0b10100000,
             0b00001111, 0b11000000,
             0b00111111, 0b11101000,
             0b00111111, 0b01010000,
             0b01111111, 0b11101010,
             0b01111111, 0b11010100,
             0b11111111, 0b10101010,
             0b01110111, 0b01010000,
             0b11111111, 0b11101010,
             0b01010101, 0b01000000,
             0b00111010, 0b10100010,
             0b00010101, 0b00000000,
             0b00101010, 0b10101000,
             0b00000100, 0b00000000,
             0b00000010, 0b00100000,
             0b00000000, 0b00000000
        };

        SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};

        for (auto y = -(bitmap.height() / 2) ;
             y < (oled.height() + (bitmap.height() / 2)) ;
             y += bitmap.height())
        {
            for (auto x = -(bitmap.width() / 2) ;
                 x < (oled.width() + (bitmap.width() / 2)) ;
                 x += bitmap.width())
            {
                oled.setFrom(bitmap, SSD1306::OledPoint{x, y});
            }
        }

        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}